

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O0

void __thiscall
capnp::compiler::CapnpParser::CapnpParser
          (CapnpParser *this,Orphanage orphanageParam,ErrorReporter *errorReporterParam)

{
  OneOf_<kj::parse::Transform_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::Param>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:872:11)>,_kj::parse::Transform_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::LocatedExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:886:11)>,_kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:894:11)>_>
  *subParsers_2;
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>
  *pPVar1;
  Transform_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Optional_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:386:7)>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:402:9)>
  *other;
  TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,_(capnp::compiler::Token::Which)2,_&capnp::compiler::Token::Reader::getIntegerLiteral>_>
  *pTVar2;
  TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<double,_(capnp::compiler::Token::Which)3,_&capnp::compiler::Token::Reader::getFloatLiteral>_>
  *subParsers_1;
  TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
  *subParsers_1_00;
  TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)1,_&capnp::compiler::Token::Reader::getStringLiteral>_>
  *pTVar3;
  TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>
  *pTVar4;
  Transform_<_961a2952_> *other_00;
  Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:584:7)>
  *other_01;
  Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,_(capnp::compiler::Token::Which)2,_&capnp::compiler::Token::Reader::getIntegerLiteral>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:615:7)>
  *other_02;
  Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,_(capnp::compiler::Token::Which)2,_&capnp::compiler::Token::Reader::getIntegerLiteral>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:625:7)>
  *other_03;
  Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::Optional_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:638:7)>
  *other_04;
  Transform_<_d21f4a42_> *other_05;
  Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&>,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:680:7)>
  *other_06;
  Transform_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:690:7)>
  *other_07;
  Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&>,_kj::parse::Optional_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>_>_>,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:703:7)>
  *other_08;
  Transform_<_64b3588c_> *other_09;
  Type *functor;
  OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&,_kj::parse::Optional_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>,_kj::parse::Optional_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:737:11)>,_kj::parse::Transform_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:744:11)>_>
  *subParsers;
  EndOfInput_ *subParsers_1_01;
  Transform_<_86bdfae4_> *other_10;
  Transform_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:803:7)>
  *other_11;
  Transform_<_e7ebaeb1_> *other_12;
  TransformWithLocation_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&,_kj::parse::Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>_>,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:848:7)>
  *other_13;
  Transform_<_6ebdf19a_> *other_14;
  Type *functor_00;
  Transform_<_ad3c9ce5_> *other_15;
  OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>
  *other_16;
  OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:1005:7)>_&,_kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:1012:7)>_&>
  *other_17;
  OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>
  *other_18;
  OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>
  *other_19;
  OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>
  *other_20;
  Arena *pAVar5;
  Arena *pAVar6;
  Parser<Orphan<Expression>_> *pPVar7;
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>
  *pPVar8;
  TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
  *pTVar9;
  Parser<Orphan<LocatedInteger>_> *subParsers_00;
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
  *parsers_1;
  Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>
  *subParser;
  Type errorReporter;
  OneOf_<kj::parse::TransformWithLocation_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:547:19)>,_kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::(anonymous_namespace)::Located<capnp::Orphan<capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>_>_>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:556:19)>_>
  *subParser_00;
  Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>
  *subParser_01;
  Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>_>
  *subParser_02;
  Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>
  *subParser_03;
  Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>_>
  *subParser_04;
  ExactString subParsers_1_02;
  Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>_>_>
  *subParser_05;
  Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>
  *subParser_06;
  Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)6,_&capnp::compiler::Token::Reader::getBracketedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>_>
  *subParser_07;
  Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::Param>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:872:11)>,_kj::parse::Transform_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::LocatedExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:886:11)>,_kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:894:11)>_>_&>
  *subParser_08;
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
  *parsers;
  Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<double,_(capnp::compiler::Token::Which)3,_&capnp::compiler::Token::Reader::getFloatLiteral>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:445:19)>
  *parsers_3;
  Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&>
  *subParsers_2_00;
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>
  *pPVar10;
  Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:1012:7)>
  *parsers_2;
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
  *parsers_3_00;
  TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
  TVar11;
  TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
  TVar12;
  Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>_>_>_>
  *subParsers_4;
  Parser<Orphan<Expression>_> *subParsers_5;
  Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::(anonymous_namespace)::Located<capnp::Orphan<capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>_>_>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:494:19)>
  *parsers_8;
  OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>
  local_1d90;
  OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>
  local_1d78;
  OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>
  local_1d50;
  OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:1005:7)>_&,_kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:1012:7)>_&>
  local_1d40;
  OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>
  local_1d20;
  Type local_1ce8;
  Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:1012:7)>
  local_1ce0;
  Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:1012:7)>
  *local_1cd0;
  Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:1012:7)>
  *nakedAnnotation;
  Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:1005:7)>
  local_1cc0;
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
  *local_1cb0;
  Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:1005:7)>
  *nakedId;
  undefined1 local_1ca0 [8];
  undefined1 local_1c98 [56];
  undefined1 local_1c60 [8];
  TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
  local_1c58;
  Sequence_<_cfa8dfdf_> local_1c48;
  Transform_<_ad3c9ce5_> local_1bd8;
  undefined1 local_1b59;
  Type *local_1b58;
  char *local_1b50;
  TransformWithLocation_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:938:11)>
  local_1b48;
  OneOf_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformWithLocation_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:938:11)>_>
  local_1b30;
  OneOf_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformWithLocation_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:938:11)>_>
  *local_1b08;
  OneOf_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformWithLocation_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:938:11)>_>
  *annotationTarget;
  undefined1 local_1af8 [8];
  TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
  local_1af0;
  Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::Param>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:872:11)>,_kj::parse::Transform_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::LocatedExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:886:11)>,_kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:894:11)>_>_&>
  local_1ae0;
  undefined1 local_1ac0 [32];
  Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)6,_&capnp::compiler::Token::Reader::getBracketedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>_>
  local_1aa0;
  Optional_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)6,_&capnp::compiler::Token::Reader::getBracketedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>_>_>
  local_1a78;
  Sequence_<_955122d8_> local_1a50;
  Transform_<_6ebdf19a_> local_19e0;
  Type local_1968;
  undefined1 local_1960 [24];
  TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::LocatedExactString>
  local_1948;
  undefined1 local_1938 [24];
  undefined1 local_1920 [8];
  Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::Param>_>_&>_>
  local_1918;
  Transform_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::Param>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:872:11)>
  local_18f0;
  OneOf_<kj::parse::Transform_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::Param>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:872:11)>,_kj::parse::Transform_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::LocatedExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:886:11)>,_kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:894:11)>_>
  local_18c0;
  OneOf_<kj::parse::Transform_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::Param>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:872:11)>,_kj::parse::Transform_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::LocatedExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:886:11)>,_kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:894:11)>_>
  *local_1860;
  OneOf_<kj::parse::Transform_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::Param>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:872:11)>,_kj::parse::Transform_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::LocatedExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:886:11)>,_kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:894:11)>_>
  *paramList;
  undefined1 local_1850 [8];
  TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
  local_1848;
  Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>
  local_1838;
  Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>_>
  local_1818;
  TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
  local_17f8;
  Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&,_kj::parse::Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>_>,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>
  local_17e8;
  TransformWithLocation_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&,_kj::parse::Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>_>,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:848:7)>
  local_1798;
  undefined1 local_1740 [16];
  Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>_>
  local_1730;
  TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
  local_1708;
  Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>_>_>
  local_16f8;
  Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>_>_>_>
  local_16b8;
  Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>_>
  local_1678;
  Optional_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>_>_>
  local_1650;
  undefined1 local_1628 [8];
  TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
  local_1620;
  Sequence_<_65cb9751_> local_1610;
  Transform_<_e7ebaeb1_> local_1578;
  undefined1 local_14d8 [48];
  Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>
  local_14a8;
  Transform_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:803:7)>
  local_1470;
  undefined1 local_1430 [16];
  EndOfInput_ *local_1420;
  ExactString local_1418;
  Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::EndOfInput__&>
  local_1410;
  undefined1 local_13f0 [40];
  undefined1 local_13c8 [8];
  undefined1 local_13c0 [16];
  Sequence_<_5d146e8b_> local_13b0;
  OneOf_<_9492767f_> local_1380;
  Transform_<_86bdfae4_> local_1320;
  undefined1 local_12b1;
  Type *local_12b0;
  char *local_12a8;
  undefined1 local_12a0 [32];
  TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
  local_1280;
  TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
  local_1270;
  TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
  local_1260;
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>
  local_1250;
  Sequence_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&,_kj::parse::Optional_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>,_kj::parse::Optional_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>
  local_1240;
  Transform_<kj::parse::Sequence_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&,_kj::parse::Optional_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>,_kj::parse::Optional_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:737:11)>
  local_1210;
  OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&,_kj::parse::Optional_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>,_kj::parse::Optional_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:737:11)>,_kj::parse::Transform_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:744:11)>_>
  local_11d8;
  OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&,_kj::parse::Optional_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>,_kj::parse::Optional_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:737:11)>,_kj::parse::Transform_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:744:11)>_>
  *local_1180;
  OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&,_kj::parse::Optional_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>,_kj::parse::Optional_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:737:11)>,_kj::parse::Transform_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:744:11)>_>
  *ordinalOrColon;
  undefined1 local_1170 [8];
  TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
  local_1168;
  Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>
  local_1158;
  Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>_>
  local_1138;
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>
  local_1118;
  Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&,_kj::parse::Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>_>,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>
  local_1108;
  Transform_<_64b3588c_> local_10b0;
  undefined1 local_1050 [16];
  Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>_>
  local_1040;
  Optional_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>_>_>
  local_1018;
  undefined1 local_ff0 [8];
  TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
  local_fe8;
  Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&>,_kj::parse::Optional_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>_>_>,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>
  local_fd8;
  Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&>,_kj::parse::Optional_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>_>_>,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:703:7)>
  local_f80;
  undefined1 local_f20 [16];
  Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>
  local_f10;
  Transform_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:690:7)>
  local_ef0;
  undefined1 local_ec8 [24];
  TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
  local_eb0;
  Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&>,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>
  local_ea0;
  Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&>,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:680:7)>
  local_e70;
  undefined1 local_e38 [16];
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>
  local_e28;
  TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
  local_e18;
  undefined1 local_e08 [8];
  TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
  local_e00;
  Sequence_<_612bb1dc_> local_df0;
  Transform_<_d21f4a42_> local_d90;
  undefined1 local_d28 [24];
  Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>
  local_d10;
  Optional_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>
  local_cf0;
  TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
  local_cd0;
  Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::Optional_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>
  local_cc0;
  Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::Optional_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:638:7)>
  local_c80;
  undefined1 local_c38 [8];
  ExactString local_c30;
  TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,_(capnp::compiler::Token::Which)2,_&capnp::compiler::Token::Reader::getIntegerLiteral>_>
  *local_c28;
  Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,_(capnp::compiler::Token::Which)2,_&capnp::compiler::Token::Reader::getIntegerLiteral>_>_&>
  local_c20;
  Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,_(capnp::compiler::Token::Which)2,_&capnp::compiler::Token::Reader::getIntegerLiteral>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:625:7)>
  local_c00;
  undefined1 local_bd8 [8];
  ExactString local_bd0;
  TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,_(capnp::compiler::Token::Which)2,_&capnp::compiler::Token::Reader::getIntegerLiteral>_>
  *local_bc8;
  Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,_(capnp::compiler::Token::Which)2,_&capnp::compiler::Token::Reader::getIntegerLiteral>_>_&>
  local_bc0;
  Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,_(capnp::compiler::Token::Which)2,_&capnp::compiler::Token::Reader::getIntegerLiteral>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:615:7)>
  local_ba0;
  undefined1 local_b78 [8];
  ExactString local_b70;
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>
  *local_b68;
  Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>
  local_b60;
  Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:584:7)>
  local_b40;
  Type local_b11;
  Type local_b10;
  undefined1 local_b08 [24];
  TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>
  *local_af0;
  Type local_ae8;
  Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>
  local_ae0;
  TransformWithLocation_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:547:19)>
  local_ac0;
  OneOf_<kj::parse::TransformWithLocation_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:547:19)>,_kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::(anonymous_namespace)::Located<capnp::Orphan<capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>_>_>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:556:19)>_>
  local_a98;
  Many_<kj::parse::OneOf_<kj::parse::TransformWithLocation_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:547:19)>,_kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::(anonymous_namespace)::Located<capnp::Orphan<capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>_>_>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:556:19)>_>,_false>
  local_a58;
  Type local_a18;
  Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:537:19)>
  local_a10;
  undefined1 local_a00 [8];
  ExactString local_9f8;
  TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>
  *local_9f0;
  Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>
  local_9e8;
  TransformWithLocation_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:528:19)>
  local_9c8;
  undefined1 local_9a0 [8];
  ExactString local_998;
  TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)1,_&capnp::compiler::Token::Reader::getStringLiteral>_>
  *local_990;
  Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)1,_&capnp::compiler::Token::Reader::getStringLiteral>_>_&>
  local_988;
  TransformWithLocation_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)1,_&capnp::compiler::Token::Reader::getStringLiteral>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:519:19)>
  local_968;
  undefined1 local_940 [8];
  ExactString local_938;
  TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)1,_&capnp::compiler::Token::Reader::getStringLiteral>_>
  *local_930;
  Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)1,_&capnp::compiler::Token::Reader::getStringLiteral>_>_&>
  local_928;
  TransformWithLocation_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)1,_&capnp::compiler::Token::Reader::getStringLiteral>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:510:19)>
  local_908;
  Type local_8e0;
  Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::(anonymous_namespace)::Located<capnp::Orphan<capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>_>_>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:494:19)>
  local_8d8;
  undefined1 local_8c8 [8];
  Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)6,_&capnp::compiler::Token::Reader::getBracketedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>_>
  local_8c0;
  Transform_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)6,_&capnp::compiler::Token::Reader::getBracketedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:480:19)>
  local_898;
  Type local_868;
  Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Data::Reader,_(capnp::compiler::Token::Which)7,_&capnp::compiler::Token::Reader::getBinaryLiteral>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:472:19)>
  local_860;
  Type local_850;
  Many_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)1,_&capnp::compiler::Token::Reader::getStringLiteral>_>_&,_true>
  local_848;
  Transform_<kj::parse::Many_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)1,_&capnp::compiler::Token::Reader::getStringLiteral>_>_&,_true>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:462:19)>
  local_840;
  undefined1 local_830 [24];
  TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
  local_818;
  Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>
  local_808;
  TransformWithLocation_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:453:19)>
  local_7e0;
  undefined1 local_7b0 [8];
  ExactString local_7a8;
  TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<double,_(capnp::compiler::Token::Which)3,_&capnp::compiler::Token::Reader::getFloatLiteral>_>
  *local_7a0;
  Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<double,_(capnp::compiler::Token::Which)3,_&capnp::compiler::Token::Reader::getFloatLiteral>_>_&>
  local_798;
  Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<double,_(capnp::compiler::Token::Which)3,_&capnp::compiler::Token::Reader::getFloatLiteral>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:445:19)>
  local_778;
  Type local_750;
  Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<double,_(capnp::compiler::Token::Which)3,_&capnp::compiler::Token::Reader::getFloatLiteral>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:437:19)>
  local_748;
  undefined1 local_738 [8];
  ExactString local_730;
  TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,_(capnp::compiler::Token::Which)2,_&capnp::compiler::Token::Reader::getIntegerLiteral>_>
  *local_728;
  Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,_(capnp::compiler::Token::Which)2,_&capnp::compiler::Token::Reader::getIntegerLiteral>_>_&>
  local_720;
  Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,_(capnp::compiler::Token::Which)2,_&capnp::compiler::Token::Reader::getIntegerLiteral>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:429:19)>
  local_700;
  Type local_6d8;
  Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,_(capnp::compiler::Token::Which)2,_&capnp::compiler::Token::Reader::getIntegerLiteral>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:421:19)>
  local_6d0;
  OneOf_<_6a6ae63_> local_6c0;
  Sequence_<_50687a5e_> local_530;
  Transform_<_961a2952_> local_358;
  undefined1 local_178 [8];
  Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Optional_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:386:7)>_&>_>
  local_170;
  Transform_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Optional_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:386:7)>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:402:9)>
  local_148;
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::(anonymous_namespace)::Located<capnp::Orphan<capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>_>_>_>
  local_118;
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::(anonymous_namespace)::Located<capnp::Orphan<capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>_>_>_>
  *local_108;
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::(anonymous_namespace)::Located<capnp::Orphan<capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>_>_>_>
  *tuple;
  undefined1 local_f8 [16];
  Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>
  local_e8;
  Optional_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>
  local_c8;
  Sequence_<kj::parse::Optional_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>
  local_a8;
  Transform_<kj::parse::Sequence_<kj::parse::Optional_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:386:7)>
  local_78;
  Transform_<kj::parse::Sequence_<kj::parse::Optional_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:386:7)>
  *local_40;
  Transform_<kj::parse::Sequence_<kj::parse::Optional_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:386:7)>
  *tupleElement;
  ErrorReporter *local_28;
  ErrorReporter *errorReporterParam_local;
  CapnpParser *this_local;
  Orphanage orphanageParam_local;
  
  orphanageParam_local.arena = (BuilderArena *)orphanageParam.capTable;
  this_local = (CapnpParser *)orphanageParam.arena;
  (this->orphanage).arena = (BuilderArena *)this_local;
  (this->orphanage).capTable = (CapTableBuilder *)orphanageParam_local.arena;
  this->errorReporter = errorReporterParam;
  local_28 = errorReporterParam;
  errorReporterParam_local = (ErrorReporter *)this;
  kj::Arena::Arena(&this->arena,0x400);
  Parsers::Parsers(&this->parsers);
  TVar11 = anon_unknown_0::op("=");
  local_f8._8_8_ = TVar11.transform.expected;
  pPVar1 = (ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>
            *)TVar11.subParser;
  local_f8._0_8_ = pPVar1;
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>
            (&local_e8,(parse *)compiler::(anonymous_namespace)::identifier,
             (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>
              *)local_f8,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)pPVar1);
  kj::parse::
  optional<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>>
            (&local_c8,(parse *)&local_e8,subParser);
  kj::parse::
  sequence<kj::parse::Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>>,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&>
            (&local_a8,(parse *)&local_c8,
             (Optional_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>
              *)&(this->parsers).expression,pPVar1);
  tuple = (ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::(anonymous_namespace)::Located<capnp::Orphan<capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>_>_>_>
           *)this;
  kj::parse::
  transform<kj::parse::Sequence_<kj::parse::Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>>,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__0>
            (&local_78,(parse *)&local_a8,
             (Sequence_<kj::parse::Optional_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>
              *)&tuple,(Type *)pPVar1);
  local_40 = kj::Arena::
             copy<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>>,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__0>>
                       (&this->arena,&local_78);
  pAVar5 = &this->arena;
  pAVar6 = pAVar5;
  compiler::(anonymous_namespace)::
  parenthesizedList<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>>,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__0>&>
            ((Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Optional_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:386:7)>_&>_>
              *)(local_178 + 8),(_anonymous_namespace_ *)local_40,
             (Transform_<kj::parse::Sequence_<kj::parse::Optional_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:386:7)>
              *)this->errorReporter,(ErrorReporter *)pAVar5);
  local_178 = (undefined1  [8])this;
  kj::parse::
  transform<kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,(capnp::Kind)3>,(capnp::Kind)6>::Reader,(capnp::compiler::Token::Which)5,&(capnp::compiler::Token::Reader::getParenthesizedList()const)>>const&,capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>>,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__0>&>>,capnp::compiler::CapnpParser::Transform_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__1>
            (&local_148,(parse *)(local_178 + 8),
             (Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Optional_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:386:7)>_&>_>
              *)local_178,(Type *)pAVar6);
  other = kj::Arena::
          copy<kj::parse::Transform_<kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,(capnp::Kind)3>,(capnp::Kind)6>::Reader,(capnp::compiler::Token::Which)5,&(capnp::compiler::Token::Reader::getParenthesizedList()const)>>const&,capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>>,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__0>&>>,capnp::compiler::CapnpParser::Transform_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__1>>
                    (pAVar5,&local_148);
  kj::parse::
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::(anonymous_namespace)::Located<capnp::Orphan<capnp::List<capnp::compiler::Expression::Param,(capnp::Kind)3>>>>
  ::
  ParserRef<kj::parse::Transform_<kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,(capnp::Kind)3>,(capnp::Kind)6>::Reader,(capnp::compiler::Token::Which)5,&(capnp::compiler::Token::Reader::getParenthesizedList()const)>>const&,capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>>,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__0>&>>,capnp::compiler::CapnpParser::Transform_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__1>&>
            ((ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::(anonymous_namespace)::Located<capnp::Orphan<capnp::List<capnp::compiler::Expression::Param,(capnp::Kind)3>>>>
              *)&local_118,other);
  local_108 = kj::Arena::
              copy<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::(anonymous_namespace)::Located<capnp::Orphan<capnp::List<capnp::compiler::Expression::Param,(capnp::Kind)3>>>>>
                        (pAVar5,&local_118);
  local_6d8.this = this;
  local_6d0 = kj::parse::
              transform<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,(capnp::compiler::Token::Which)2,&(capnp::compiler::Token::Reader::getIntegerLiteral()const)>>const&,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__2>
                        ((TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,_(capnp::compiler::Token::Which)2,_&capnp::compiler::Token::Reader::getIntegerLiteral>_>
                          *)compiler::(anonymous_namespace)::integerLiteral,&local_6d8);
  TVar11 = anon_unknown_0::op("-");
  local_728 = (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,_(capnp::compiler::Token::Which)2,_&capnp::compiler::Token::Reader::getIntegerLiteral>_>
               *)TVar11.transform.expected;
  pTVar2 = (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,_(capnp::compiler::Token::Which)2,_&capnp::compiler::Token::Reader::getIntegerLiteral>_>
            *)TVar11.subParser;
  local_730.expected = (char *)pTVar2;
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,(capnp::compiler::Token::Which)2,&(capnp::compiler::Token::Reader::getIntegerLiteral()const)>>const&>
            (&local_720,(parse *)&local_730,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)compiler::(anonymous_namespace)::integerLiteral,pTVar2);
  local_738 = (undefined1  [8])this;
  kj::parse::
  transform<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,(capnp::compiler::Token::Which)2,&(capnp::compiler::Token::Reader::getIntegerLiteral()const)>>const&>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__3>
            (&local_700,(parse *)&local_720,
             (Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,_(capnp::compiler::Token::Which)2,_&capnp::compiler::Token::Reader::getIntegerLiteral>_>_&>
              *)local_738,(Type *)pTVar2);
  local_750.this = this;
  local_748 = kj::parse::
              transform<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<double,(capnp::compiler::Token::Which)3,&(capnp::compiler::Token::Reader::getFloatLiteral()const)>>const&,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__4>
                        ((TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<double,_(capnp::compiler::Token::Which)3,_&capnp::compiler::Token::Reader::getFloatLiteral>_>
                          *)compiler::(anonymous_namespace)::floatLiteral,&local_750);
  TVar11 = anon_unknown_0::op("-");
  local_7a0 = (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<double,_(capnp::compiler::Token::Which)3,_&capnp::compiler::Token::Reader::getFloatLiteral>_>
               *)TVar11.transform.expected;
  subParsers_1 = (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<double,_(capnp::compiler::Token::Which)3,_&capnp::compiler::Token::Reader::getFloatLiteral>_>
                  *)TVar11.subParser;
  local_7a8.expected = (char *)subParsers_1;
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<double,(capnp::compiler::Token::Which)3,&(capnp::compiler::Token::Reader::getFloatLiteral()const)>>const&>
            (&local_798,(parse *)&local_7a8,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)compiler::(anonymous_namespace)::floatLiteral,subParsers_1);
  local_7b0 = (undefined1  [8])this;
  kj::parse::
  transform<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<double,(capnp::compiler::Token::Which)3,&(capnp::compiler::Token::Reader::getFloatLiteral()const)>>const&>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__5>
            (&local_778,(parse *)&local_798,
             (Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<double,_(capnp::compiler::Token::Which)3,_&capnp::compiler::Token::Reader::getFloatLiteral>_>_&>
              *)local_7b0,(Type *)subParsers_1);
  local_818 = anon_unknown_0::op("-");
  TVar12 = anon_unknown_0::keyword("inf");
  local_830._16_8_ = TVar12.transform.expected;
  subParsers_1_00 =
       (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
        *)TVar12.subParser;
  local_830._8_8_ = subParsers_1_00;
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>
            (&local_808,(parse *)(local_830 + 0x18),
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)(local_830 + 8),subParsers_1_00);
  local_830._0_8_ = this;
  kj::parse::
  transformWithLocation<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__6>
            (&local_7e0,(parse *)&local_808,
             (Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>
              *)local_830,(Type *)subParsers_1_00);
  local_848 = kj::parse::
              oneOrMore<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)1,&(capnp::compiler::Token::Reader::getStringLiteral()const)>>const&>
                        ((TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)1,_&capnp::compiler::Token::Reader::getStringLiteral>_>
                          *)compiler::(anonymous_namespace)::stringLiteral);
  local_850.this = this;
  local_840 = kj::parse::
              transform<kj::parse::Many_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)1,&(capnp::compiler::Token::Reader::getStringLiteral()const)>>const&,true>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__7>
                        (&local_848,&local_850);
  local_868.this = this;
  local_860 = kj::parse::
              transform<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Data::Reader,(capnp::compiler::Token::Which)7,&(capnp::compiler::Token::Reader::getBinaryLiteral()const)>>const&,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__8>
                        ((TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Data::Reader,_(capnp::compiler::Token::Which)7,_&capnp::compiler::Token::Reader::getBinaryLiteral>_>
                          *)compiler::(anonymous_namespace)::binaryLiteral,&local_868);
  errorReporter = local_860.transform.this;
  compiler::(anonymous_namespace)::
  bracketedList<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&>
            ((Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)6,_&capnp::compiler::Token::Reader::getBracketedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>_>
              *)(local_8c8 + 8),(_anonymous_namespace_ *)&(this->parsers).expression,
             (ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>
              *)this->errorReporter,(ErrorReporter *)errorReporter.this);
  local_8c8 = (undefined1  [8])this;
  kj::parse::
  transform<kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,(capnp::Kind)3>,(capnp::Kind)6>::Reader,(capnp::compiler::Token::Which)6,&(capnp::compiler::Token::Reader::getBracketedList()const)>>const&,capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&>>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__9>
            (&local_898,(parse *)(local_8c8 + 8),
             (Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)6,_&capnp::compiler::Token::Reader::getBracketedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>_>
              *)local_8c8,(Type *)errorReporter.this);
  local_8e0.this = this;
  local_8d8 = kj::parse::
              transform<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::(anonymous_namespace)::Located<capnp::Orphan<capnp::List<capnp::compiler::Expression::Param,(capnp::Kind)3>>>>&,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__10>
                        (local_108,&local_8e0);
  TVar12 = anon_unknown_0::keyword("import");
  local_930 = (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)1,_&capnp::compiler::Token::Reader::getStringLiteral>_>
               *)TVar12.transform.expected;
  pTVar3 = (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)1,_&capnp::compiler::Token::Reader::getStringLiteral>_>
            *)TVar12.subParser;
  local_938.expected = (char *)pTVar3;
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)1,&(capnp::compiler::Token::Reader::getStringLiteral()const)>>const&>
            (&local_928,(parse *)&local_938,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)compiler::(anonymous_namespace)::stringLiteral,pTVar3);
  local_940 = (undefined1  [8])this;
  kj::parse::
  transformWithLocation<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)1,&(capnp::compiler::Token::Reader::getStringLiteral()const)>>const&>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__11>
            (&local_908,(parse *)&local_928,
             (Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)1,_&capnp::compiler::Token::Reader::getStringLiteral>_>_&>
              *)local_940,(Type *)pTVar3);
  TVar12 = anon_unknown_0::keyword("embed");
  local_990 = (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)1,_&capnp::compiler::Token::Reader::getStringLiteral>_>
               *)TVar12.transform.expected;
  pTVar3 = (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)1,_&capnp::compiler::Token::Reader::getStringLiteral>_>
            *)TVar12.subParser;
  local_998.expected = (char *)pTVar3;
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)1,&(capnp::compiler::Token::Reader::getStringLiteral()const)>>const&>
            (&local_988,(parse *)&local_998,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)compiler::(anonymous_namespace)::stringLiteral,pTVar3);
  local_9a0 = (undefined1  [8])this;
  kj::parse::
  transformWithLocation<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)1,&(capnp::compiler::Token::Reader::getStringLiteral()const)>>const&>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__12>
            (&local_968,(parse *)&local_988,
             (Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)1,_&capnp::compiler::Token::Reader::getStringLiteral>_>_&>
              *)local_9a0,(Type *)pTVar3);
  TVar11 = anon_unknown_0::op(".");
  local_9f0 = (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>
               *)TVar11.transform.expected;
  pTVar4 = (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>
            *)TVar11.subParser;
  local_9f8.expected = (char *)pTVar4;
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&>
            (&local_9e8,(parse *)&local_9f8,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)compiler::(anonymous_namespace)::identifier,pTVar4);
  local_a00 = (undefined1  [8])this;
  kj::parse::
  transformWithLocation<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__13>
            (&local_9c8,(parse *)&local_9e8,
             (Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>
              *)local_a00,(Type *)pTVar4);
  local_a18.this = this;
  local_a10 = kj::parse::
              transform<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__14>
                        ((TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>
                          *)compiler::(anonymous_namespace)::identifier,&local_a18);
  parsers_8 = &local_8d8;
  parsers_3 = &local_778;
  kj::parse::oneOf<_6a6ae63_>
            (&local_6c0,&local_6d0,&local_700,&local_748,parsers_3,&local_7e0,&local_840,&local_860,
             &local_898,parsers_8,&local_908,&local_968,&local_9c8,&local_a10);
  TVar11 = anon_unknown_0::op(".");
  local_ae8.this = (CapnpParser *)TVar11.transform.expected;
  pTVar4 = (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>
            *)TVar11.subParser;
  local_af0 = pTVar4;
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&>
            (&local_ae0,(parse *)&local_af0,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)compiler::(anonymous_namespace)::identifier,pTVar4);
  local_b08._16_8_ = this;
  kj::parse::
  transformWithLocation<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__15>
            (&local_ac0,(parse *)&local_ae0,
             (Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>
              *)(local_b08 + 0x10),(Type *)pTVar4);
  local_b10.this = this;
  local_b08._0_16_ =
       (undefined1  [16])
       kj::parse::
       transform<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::(anonymous_namespace)::Located<capnp::Orphan<capnp::List<capnp::compiler::Expression::Param,(capnp::Kind)3>>>>&,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__16>
                 (local_108,&local_b10);
  kj::parse::
  oneOf<kj::parse::TransformWithLocation_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__15>,kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::(anonymous_namespace)::Located<capnp::Orphan<capnp::List<capnp::compiler::Expression::Param,(capnp::Kind)3>>>>&,capnp::compiler::CapnpParser::ParserRef(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__16>>
            (&local_a98,(parse *)&local_ac0,
             (TransformWithLocation_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:547:19)>
              *)local_b08,
             (Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::(anonymous_namespace)::Located<capnp::Orphan<capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>_>_>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:556:19)>
              *)local_b08._0_8_);
  kj::parse::
  many<kj::parse::OneOf_<kj::parse::TransformWithLocation_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__15>,kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::(anonymous_namespace)::Located<capnp::Orphan<capnp::List<capnp::compiler::Expression::Param,(capnp::Kind)3>>>>&,capnp::compiler::CapnpParser::ParserRef(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__16>>>
            (&local_a58,(parse *)&local_a98,subParser_00);
  kj::parse::sequence<_50687a5e_>(&local_530,&local_6c0,&local_a58);
  kj::parse::transform<_961a2952_>(&local_358,&local_530,&local_b11);
  other_00 = kj::Arena::copy<_ed2fa549_>(&this->arena,&local_358);
  kj::parse::
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>
  ::operator=<_b8c503fd_>(&(this->parsers).expression,other_00);
  TVar11 = anon_unknown_0::op("$");
  local_b68 = (ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>
               *)TVar11.transform.expected;
  pPVar1 = (ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>
            *)TVar11.subParser;
  local_b70.expected = (char *)pPVar1;
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&>
            (&local_b60,(parse *)&local_b70,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)&(this->parsers).expression,pPVar1);
  local_b78 = (undefined1  [8])this;
  kj::parse::
  transform<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__18>
            (&local_b40,(parse *)&local_b60,
             (Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>
              *)local_b78,(Type *)pPVar1);
  other_01 = kj::Arena::
             copy<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__18>>
                       (&this->arena,&local_b40);
  kj::parse::
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>
  ::operator=((ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>
               *)&(this->parsers).annotation,other_01);
  TVar11 = anon_unknown_0::op("@");
  local_bc8 = (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,_(capnp::compiler::Token::Which)2,_&capnp::compiler::Token::Reader::getIntegerLiteral>_>
               *)TVar11.transform.expected;
  pTVar2 = (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,_(capnp::compiler::Token::Which)2,_&capnp::compiler::Token::Reader::getIntegerLiteral>_>
            *)TVar11.subParser;
  local_bd0.expected = (char *)pTVar2;
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,(capnp::compiler::Token::Which)2,&(capnp::compiler::Token::Reader::getIntegerLiteral()const)>>const&>
            (&local_bc0,(parse *)&local_bd0,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)compiler::(anonymous_namespace)::integerLiteral,pTVar2);
  local_bd8 = (undefined1  [8])this;
  kj::parse::
  transform<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,(capnp::compiler::Token::Which)2,&(capnp::compiler::Token::Reader::getIntegerLiteral()const)>>const&>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__19>
            (&local_ba0,(parse *)&local_bc0,
             (Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,_(capnp::compiler::Token::Which)2,_&capnp::compiler::Token::Reader::getIntegerLiteral>_>_&>
              *)local_bd8,(Type *)pTVar2);
  other_02 = kj::Arena::
             copy<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,(capnp::compiler::Token::Which)2,&(capnp::compiler::Token::Reader::getIntegerLiteral()const)>>const&>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__19>>
                       (&this->arena,&local_ba0);
  kj::parse::
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>
  ::operator=((ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>
               *)&(this->parsers).uid,other_02);
  TVar11 = anon_unknown_0::op("@");
  local_c28 = (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,_(capnp::compiler::Token::Which)2,_&capnp::compiler::Token::Reader::getIntegerLiteral>_>
               *)TVar11.transform.expected;
  pTVar2 = (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,_(capnp::compiler::Token::Which)2,_&capnp::compiler::Token::Reader::getIntegerLiteral>_>
            *)TVar11.subParser;
  local_c30.expected = (char *)pTVar2;
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,(capnp::compiler::Token::Which)2,&(capnp::compiler::Token::Reader::getIntegerLiteral()const)>>const&>
            (&local_c20,(parse *)&local_c30,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)compiler::(anonymous_namespace)::integerLiteral,pTVar2);
  local_c38 = (undefined1  [8])this;
  kj::parse::
  transform<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,(capnp::compiler::Token::Which)2,&(capnp::compiler::Token::Reader::getIntegerLiteral()const)>>const&>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__20>
            (&local_c00,(parse *)&local_c20,
             (Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,_(capnp::compiler::Token::Which)2,_&capnp::compiler::Token::Reader::getIntegerLiteral>_>_&>
              *)local_c38,(Type *)pTVar2);
  other_03 = kj::Arena::
             copy<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<unsigned_long,(capnp::compiler::Token::Which)2,&(capnp::compiler::Token::Reader::getIntegerLiteral()const)>>const&>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__20>>
                       (&this->arena,&local_c00);
  kj::parse::
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>
  ::operator=((ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>
               *)&(this->parsers).ordinal,other_03);
  local_cd0 = anon_unknown_0::keyword("using");
  local_d28._8_16_ = (undefined1  [16])anon_unknown_0::op("=");
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>
            ((Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>
              *)(local_d28 + 0x18),(parse *)compiler::(anonymous_namespace)::identifier,
             (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>
              *)(local_d28 + 8),local_d28._8_8_);
  kj::parse::
  optional<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>>
            (&local_cf0,(parse *)(local_d28 + 0x18),subParser_01);
  pPVar7 = &(this->parsers).expression;
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>>,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&>
            (&local_cc0,(parse *)&local_cd0,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)&local_cf0,
             (Optional_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>
              *)pPVar7,
             (ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>
              *)parsers_3);
  local_d28._0_8_ = this;
  kj::parse::
  transform<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>>,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__21>
            (&local_c80,(parse *)&local_cc0,
             (Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::Optional_<kj::parse::Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>
              *)local_d28,(Type *)pPVar7);
  other_04 = kj::Arena::
             copy<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>>,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__21>>
                       (&this->arena,&local_c80);
  kj::parse::
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
  ::operator=((ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
               *)&(this->parsers).usingDecl,other_04);
  local_e00 = anon_unknown_0::keyword("const");
  local_e08 = (undefined1  [8])
              kj::parse::
              optional<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&>
                        (&(this->parsers).uid);
  local_e18 = anon_unknown_0::op(":");
  pPVar7 = &(this->parsers).expression;
  local_e28 = (ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>
               )anon_unknown_0::op("=");
  subParsers_5 = &(this->parsers).expression;
  local_e38._8_8_ =
       kj::parse::
       many<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&>
                 (&(this->parsers).annotation);
  pPVar1 = (ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>
            *)(local_e38 + 8);
  pPVar10 = &local_e28;
  pTVar4 = (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>
            *)local_e08;
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&>,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which___mpiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&,false>>
            (&local_df0,(parse *)&local_e00,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)compiler::(anonymous_namespace)::identifier,pTVar4,
             (Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&>
              *)&local_e18,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)pPVar7,pPVar10,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)subParsers_5,pPVar1,
             (Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>
              *)parsers_8);
  local_e38._0_8_ = this;
  kj::parse::
  transform<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&>,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::___>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__22>
            (&local_d90,(parse *)&local_df0,(Sequence_<_612bb1dc_> *)local_e38,(Type *)pTVar4);
  other_05 = kj::Arena::
             copy<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&>,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text___,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__22>>
                       (&this->arena,&local_d90);
  kj::parse::
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
  ::operator=((ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
               *)&(this->parsers).constDecl,other_05);
  local_eb0 = anon_unknown_0::keyword("enum");
  local_ec8._16_8_ =
       kj::parse::
       optional<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&>
                 (&(this->parsers).uid);
  local_ec8._8_8_ =
       kj::parse::
       many<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&>
                 (&(this->parsers).annotation);
  pTVar4 = (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>
            *)(local_ec8 + 0x10);
  subParsers_2_00 =
       (Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&>
        *)(local_ec8 + 8);
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&>,kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&,false>>
            (&local_ea0,(parse *)&local_eb0,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)compiler::(anonymous_namespace)::identifier,pTVar4,subParsers_2_00,
             (Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>
              *)pPVar7);
  local_ec8._0_8_ = this;
  kj::parse::
  transform<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&>,kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&,false>>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__23>
            (&local_e70,(parse *)&local_ea0,
             (Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&>,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>
              *)local_ec8,(Type *)pTVar4);
  other_06 = kj::Arena::
             copy<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&>,kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&,false>>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__23>>
                       (&this->arena,&local_e70);
  kj::parse::
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
  ::operator=((ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
               *)&(this->parsers).enumDecl,other_06);
  local_f20._8_8_ =
       kj::parse::
       many<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&>
                 (&(this->parsers).annotation);
  pPVar8 = (ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>
            *)(local_f20 + 8);
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&,kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&,false>>
            (&local_f10,(parse *)compiler::(anonymous_namespace)::identifier,
             (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>
              *)&(this->parsers).ordinal,pPVar8,
             (Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>
              *)subParsers_2_00);
  local_f20._0_8_ = this;
  kj::parse::
  transform<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&,kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&,false>>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__24>
            (&local_ef0,(parse *)&local_f10,
             (Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>
              *)local_f20,(Type *)pPVar8);
  other_07 = kj::Arena::
             copy<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&,kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&,false>>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__24>>
                       (&this->arena,&local_ef0);
  kj::parse::
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
  ::operator=((ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
               *)&(this->parsers).enumerantDecl,other_07);
  local_fe8 = anon_unknown_0::keyword("struct");
  local_ff0 = (undefined1  [8])
              kj::parse::
              optional<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&>
                        (&(this->parsers).uid);
  compiler::(anonymous_namespace)::
  parenthesizedList<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&>
            (&local_1040,(_anonymous_namespace_ *)compiler::(anonymous_namespace)::identifier,
             (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>
              *)this->errorReporter,(ErrorReporter *)local_ff0);
  kj::parse::
  optional<kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,(capnp::Kind)3>,(capnp::Kind)6>::Reader,(capnp::compiler::Token::Which)5,&(capnp::compiler::Token::Reader::getParenthesizedList()const)>>const&,capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&>>>
            (&local_1018,(parse *)&local_1040,subParser_02);
  local_1050._8_8_ =
       kj::parse::
       many<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&>
                 (&(this->parsers).annotation);
  pTVar4 = (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>
            *)local_ff0;
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&>,kj::parse::Optional_<kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,(capnp::Kind)3>,(capnp::Kind)6>::Reader,(capnp::compiler::Token::Which)5,&(capnp::compiler::Token::Reader::getParenthesizedList()const)>>const&,capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&>>>,kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&,false>>
            (&local_fd8,(parse *)&local_fe8,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)compiler::(anonymous_namespace)::identifier,pTVar4,
             (Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&>
              *)&local_1018,
             (Optional_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>_>_>
              *)(local_1050 + 8),
             (Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>
              *)pPVar10);
  local_1050._0_8_ = this;
  kj::parse::
  transform<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&>,kj::parse::Optional_<kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,(capnp::Kind)3>,(capnp::Kind)6>::Reader,(capnp::compiler::Token::Which)5,&(capnp::compiler::Token::Reader::getParenthesizedList()const)>>const&,capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&>>>,kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&,false>>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__25>
            (&local_f80,(parse *)&local_fd8,
             (Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&>,_kj::parse::Optional_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>_>_>,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>
              *)local_1050,(Type *)pTVar4);
  other_08 = kj::Arena::
             copy<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&>,kj::parse::Optional_<kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,(capnp::Kind)3>,(capnp::Kind)6>::Reader,(capnp::compiler::Token::Which)5,&(capnp::compiler::Token::Reader::getParenthesizedList()const)>>const&,capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&>>>,kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&,false>>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__25>>
                       (&this->arena,&local_f80);
  kj::parse::
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
  ::operator=((ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
               *)&(this->parsers).structDecl,other_08);
  local_1118 = (ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>
                )anon_unknown_0::op(":");
  pPVar7 = &(this->parsers).expression;
  local_1168 = anon_unknown_0::op("=");
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&>
            ((Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>
              *)(local_1170 + 0x18),(parse *)(local_1170 + 8),
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)&(this->parsers).expression,
             (ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>
              *)local_1168.subParser);
  kj::parse::
  optional<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&>>
            (&local_1138,(parse *)(local_1170 + 0x18),subParser_03);
  local_1170 = (undefined1  [8])
               kj::parse::
               many<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&>
                         (&(this->parsers).annotation);
  pPVar8 = &local_1118;
  pPVar10 = (ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>
             *)&local_1138;
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&>>,kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&,false>>
            (&local_1108,(parse *)compiler::(anonymous_namespace)::identifier,
             (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>
              *)&(this->parsers).ordinal,pPVar8,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)pPVar7,pPVar10,
             (Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>_>
              *)local_1170,
             (Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>
              *)subParsers_5);
  ordinalOrColon =
       (OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&,_kj::parse::Optional_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>,_kj::parse::Optional_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:737:11)>,_kj::parse::Transform_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:744:11)>_>
        *)this;
  kj::parse::
  transform<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Tok___>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__26>
            (&local_10b0,(parse *)&local_1108,
             (Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&,_kj::parse::Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>_>,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>
              *)&ordinalOrColon,(Type *)pPVar8);
  other_09 = kj::Arena::
             copy<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,cap___,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__26>>
                       (&this->arena,&local_10b0);
  kj::parse::
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
  ::operator=((ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
               *)&(this->parsers).fieldDecl,other_09);
  local_1260 = anon_unknown_0::op("!");
  local_1250 = (ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>
                )kj::parse::
                 optional<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>
                           (&local_1260);
  local_1280 = anon_unknown_0::op(":");
  local_1270 = (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
                )kj::parse::
                 optional<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>
                           (&local_1280);
  pTVar9 = &local_1270;
  kj::parse::
  sequence<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&,kj::parse::Optional_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>,kj::parse::Optional_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>>
            (&local_1240,(parse *)&(this->parsers).ordinal,&local_1250,
             (Optional_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>
              *)pTVar9,
             (Optional_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>
              *)pPVar7);
  kj::parse::
  transform<kj::parse::Sequence_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&,kj::parse::Optional_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>,kj::parse::Optional_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__27>
            (&local_1210,(parse *)&local_1240,
             (Sequence_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&,_kj::parse::Optional_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>,_kj::parse::Optional_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>
              *)(local_12a0 + 0x1f),(Type *)pTVar9);
  TVar11 = anon_unknown_0::op(":");
  local_12a8 = (char *)TVar11.transform.expected;
  functor = (Type *)TVar11.subParser;
  local_12b0 = functor;
  kj::parse::
  transform<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__28>
            ((Transform_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:744:11)>
              *)local_12a0,(parse *)&local_12b0,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)&local_12b1,functor);
  kj::parse::
  oneOf<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&,kj::parse::Optional_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>,kj::parse::Optional_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__27>,kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,capnp::compiler::CapnpParser::Transform_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__28>>
            (&local_11d8,(parse *)&local_1210,
             (Transform_<kj::parse::Sequence_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&,_kj::parse::Optional_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>,_kj::parse::Optional_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:737:11)>
              *)local_12a0,
             (Transform_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:744:11)>
              *)functor);
  subParsers = kj::Arena::
               copy<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&,kj::parse::Optional_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>,kj::parse::Optional_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__27>,kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,capnp::compiler::CapnpParser::Transform_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__28>>>
                         (&this->arena,&local_11d8);
  local_1180 = subParsers;
  local_13c0 = (undefined1  [16])anon_unknown_0::keyword("union");
  local_13c8 = (undefined1  [8])
               kj::parse::
               many<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&>
                         (&(this->parsers).annotation);
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&,kj::parse::Optional_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>,kj::parse::Optional_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymo___mpiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&,false>>
            ((Sequence_<_5d146e8b_> *)(local_13c0 + 0x10),
             (parse *)compiler::(anonymous_namespace)::identifier,
             (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>
              *)subParsers,
             (OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&,_kj::parse::Optional_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>,_kj::parse::Optional_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:737:11)>,_kj::parse::Transform_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:744:11)>_>
              *)local_13c0,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)local_13c8,
             (Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>
              *)pPVar10);
  TVar12 = anon_unknown_0::keyword("union");
  local_1418 = TVar12.transform.expected;
  subParsers_1_01 = (EndOfInput_ *)TVar12.subParser;
  local_1420 = subParsers_1_01;
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::EndOfInput_const&>
            (&local_1410,(parse *)&local_1420,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)&kj::parse::endOfInput,subParsers_1_01);
  kj::parse::
  transformWithLocation<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::EndOfInput_const&>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__29>
            ((TransformWithLocation_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::EndOfInput__&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:756:15)>
              *)local_13f0,(parse *)&local_1410,
             (Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::EndOfInput__&>
              *)(local_1430 + 0xf),(Type *)subParsers_1_01);
  kj::parse::
  oneOf<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&,kj::parse::Optional_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>,kj::parse::Optional_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::___piler::CapnpParser::TransformWithLocation_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__29>>
            ((OneOf_<_9492767f_> *)(local_13c0 + 0x40),(parse *)(local_13c0 + 0x10),
             (Sequence_<_5d146e8b_> *)local_13f0,
             (TransformWithLocation_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_const_kj::parse::EndOfInput__&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:756:15)>
              *)subParsers_1_01);
  local_1430._0_8_ = this;
  kj::parse::
  transform<kj::parse::OneOf_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&,kj::parse::Optional_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>,kj::parse::Optional_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::par_____29>>,capnp::compiler::CapnpParser::OneOf_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__30>
            (&local_1320,(parse *)(local_13c0 + 0x40),(OneOf_<_9492767f_> *)local_1430,
             (Type *)subParsers_1_01);
  other_10 = kj::Arena::
             copy<kj::parse::Transform_<kj::parse::OneOf_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&,kj::parse::Optional_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>>,kj::parse::Optional_<kj::parse::TransformOrReject_<kj::parse::Transform____29>>,capnp::compiler::CapnpParser::OneOf_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__30>>
                       (&this->arena,&local_1320);
  kj::parse::
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
  ::operator=((ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
               *)&(this->parsers).unionDecl,other_10);
  local_14d8._32_16_ = (undefined1  [16])anon_unknown_0::op(":");
  local_14d8._16_16_ = (undefined1  [16])anon_unknown_0::keyword("group");
  local_14d8._8_8_ =
       kj::parse::
       many<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&>
                 (&(this->parsers).annotation);
  pTVar9 = (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
            *)(local_14d8 + 0x10);
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&,false>>
            ((Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>
              *)(local_14d8 + 0x30),(parse *)compiler::(anonymous_namespace)::identifier,
             (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>
              *)(local_14d8 + 0x20),pTVar9,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)(local_14d8 + 8),
             (Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>
              *)pPVar10);
  local_14d8._0_8_ = this;
  kj::parse::
  transform<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&,false>>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__31>
            (&local_1470,(parse *)(local_14d8 + 0x30),
             (Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>
              *)local_14d8,(Type *)pTVar9);
  other_11 = kj::Arena::
             copy<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&,false>>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__31>>
                       (&this->arena,&local_1470);
  kj::parse::
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
  ::operator=((ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
               *)&(this->parsers).groupDecl,other_11);
  local_1620 = anon_unknown_0::keyword("interface");
  local_1628 = (undefined1  [8])
               kj::parse::
               optional<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&>
                         (&(this->parsers).uid);
  compiler::(anonymous_namespace)::
  parenthesizedList<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&>
            (&local_1678,(_anonymous_namespace_ *)compiler::(anonymous_namespace)::identifier,
             (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>
              *)this->errorReporter,(ErrorReporter *)local_1628);
  kj::parse::
  optional<kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,(capnp::Kind)3>,(capnp::Kind)6>::Reader,(capnp::compiler::Token::Which)5,&(capnp::compiler::Token::Reader::getParenthesizedList()const)>>const&,capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&>>>
            (&local_1650,(parse *)&local_1678,subParser_04);
  local_1708 = anon_unknown_0::keyword("extends");
  subParsers_1_02 = local_1708.transform.expected;
  compiler::(anonymous_namespace)::
  parenthesizedList<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&>
            (&local_1730,(_anonymous_namespace_ *)&(this->parsers).expression,
             (ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>
              *)this->errorReporter,(ErrorReporter *)subParsers_1_02.expected);
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,(capnp::Kind)3>,(capnp::Kind)6>::Reader,(capnp::compiler::Token::Which)5,&(capnp::compiler::Token::Reader::getParenthesizedList()const)>>const&,capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&>>>
            (&local_16f8,(parse *)&local_1708,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)&local_1730,
             (Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>_>
              *)subParsers_1_02.expected);
  kj::parse::
  optional<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,(capnp::Kind)3>,(capnp::Kind)6>::Reader,(capnp::compiler::Token::Which)5,&(capnp::compiler::Token::Reader::getParenthesizedList()const)>>const&,capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&>>>>
            (&local_16b8,(parse *)&local_16f8,subParser_05);
  local_1740._8_8_ =
       kj::parse::
       many<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&>
                 (&(this->parsers).annotation);
  subParsers_4 = (Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>_>_>_>
                  *)(local_1740 + 8);
  pTVar4 = (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>
            *)local_1628;
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&>,kj::parse::Optional_<kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compil___mpiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&,false>>
            (&local_1610,(parse *)&local_1620,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)compiler::(anonymous_namespace)::identifier,pTVar4,
             (Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&>
              *)&local_1650,
             (Optional_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>_>_>
              *)&local_16b8,subParsers_4,
             (Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>
              *)subParsers_5);
  local_1740._0_8_ = this;
  kj::parse::
  transform<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&>,kj::parse::Optional_<kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<cap___>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__32>
            (&local_1578,(parse *)&local_1610,(Sequence_<_65cb9751_> *)local_1740,(Type *)pTVar4);
  other_12 = kj::Arena::
             copy<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&>,kj::parse::Optional_<kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenTyp___,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__32>>
                       (&this->arena,&local_1578);
  kj::parse::
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
  ::operator=((ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
               *)&(this->parsers).interfaceDecl,other_12);
  local_17f8 = anon_unknown_0::op(":");
  pPVar7 = &(this->parsers).expression;
  local_1848 = anon_unknown_0::op("=");
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&>
            ((Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>
              *)(local_1850 + 0x18),(parse *)(local_1850 + 8),
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)&(this->parsers).expression,
             (ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>
              *)local_1848.subParser);
  kj::parse::
  optional<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&>>
            (&local_1818,(parse *)(local_1850 + 0x18),subParser_06);
  local_1850 = (undefined1  [8])
               kj::parse::
               many<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&>
                         (&(this->parsers).annotation);
  pPVar10 = (ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>
             *)&local_1818;
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&>>,kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&,false>>
            (&local_17e8,(parse *)compiler::(anonymous_namespace)::identifier,
             (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>
              *)&local_17f8,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)pPVar7,pPVar10,
             (Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>_>
              *)local_1850,
             (Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>
              *)subParsers_4);
  paramList = (OneOf_<kj::parse::Transform_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::Param>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:872:11)>,_kj::parse::Transform_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::LocatedExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:886:11)>,_kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:894:11)>_>
               *)this;
  kj::parse::
  transformWithLocation<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&>>,kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&,false>>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__33>
            (&local_1798,(parse *)&local_17e8,
             (Sequence_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&,_kj::parse::Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&>_>,_kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>_>
              *)&paramList,(Type *)pPVar7);
  other_13 = kj::Arena::
             copy<kj::parse::TransformWithLocation_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&>>,kj::parse::Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&,false>>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__33>>
                       (&this->arena,&local_1798);
  kj::parse::
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::Param>>
  ::operator=((ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::Param>>
               *)&(this->parsers).param,other_13);
  pAVar5 = &this->arena;
  pAVar6 = pAVar5;
  compiler::(anonymous_namespace)::
  parenthesizedList<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::Param>>&>
            ((Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::Param>_>_&>_>
              *)(local_1920 + 8),(_anonymous_namespace_ *)&(this->parsers).param,
             (ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::Param>_>
              *)this->errorReporter,(ErrorReporter *)pAVar5);
  local_1920 = (undefined1  [8])this;
  kj::parse::
  transform<kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,(capnp::Kind)3>,(capnp::Kind)6>::Reader,(capnp::compiler::Token::Which)5,&(capnp::compiler::Token::Reader::getParenthesizedList()const)>>const&,capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::Param>>&>>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__34>
            (&local_18f0,(parse *)(local_1920 + 8),
             (Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::Param>_>_&>_>
              *)local_1920,(Type *)pAVar6);
  local_1948 = anon_unknown_0::locatedKeyword("stream");
  local_1960._16_8_ = this;
  kj::parse::
  transform<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::LocatedExactString>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__35>
            ((Transform_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::LocatedExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:886:11)>
              *)local_1938,(parse *)&local_1948,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::LocatedExactString>
              *)(local_1960 + 0x10),(Type *)local_1948.transform.expected.expected);
  local_1968.this = this;
  local_1960._0_16_ =
       (undefined1  [16])
       kj::parse::
       transform<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__36>
                 (&(this->parsers).expression,&local_1968);
  kj::parse::
  oneOf<kj::parse::Transform_<kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,(capnp::Kind)3>,(capnp::Kind)6>::Reader,(capnp::compiler::Token::Which)5,&(capnp::compiler::Token::Reader::getParenthesizedList()const)>>const&,capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::Param>>&>>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__34>,kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::LocatedExactString>,capnp::compiler::CapnpParser::Transform_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__35>,kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&,capnp::compiler::CapnpParser::Transform_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__36>>
            (&local_18c0,(parse *)&local_18f0,
             (Transform_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::Param>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:872:11)>
              *)local_1938,
             (Transform_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::LocatedExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:886:11)>
              *)local_1960,
             (Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:894:11)>
              *)pPVar10);
  local_1860 = kj::Arena::
               copy<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,(capnp::Kind)3>,(capnp::Kind)6>::Reader,(capnp::compiler::Token::Which)5,&(capnp::compiler::Token::Reader::getParenthesizedList()const)>>const&,capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::Param>>&>>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__34>,kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::LocatedExactString>,capnp::compiler::CapnpParser::Transform_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__35>,kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&,capnp::compiler::CapnpParser::Transform_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__36>>>
                         (pAVar5,&local_18c0);
  subParsers_00 = &(this->parsers).ordinal;
  compiler::(anonymous_namespace)::
  bracketedList<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&>
            ((Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)6,_&capnp::compiler::Token::Reader::getBracketedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>_>
              *)(local_1ac0 + 0x20),
             (_anonymous_namespace_ *)compiler::(anonymous_namespace)::identifier,
             (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>
              *)this->errorReporter,(ErrorReporter *)subParsers_00);
  kj::parse::
  optional<kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,(capnp::Kind)3>,(capnp::Kind)6>::Reader,(capnp::compiler::Token::Which)6,&(capnp::compiler::Token::Reader::getBracketedList()const)>>const&,capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&>>>
            ((Optional_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)6,_&capnp::compiler::Token::Reader::getBracketedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>_>_>
              *)(local_1ac0 + 0x48),(parse *)(local_1ac0 + 0x20),subParser_07);
  subParsers_2 = local_1860;
  local_1af0 = anon_unknown_0::op("->");
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,(capnp::Kind)3>,(capnp::Kind)6>::Reader,(capnp::compiler::Token::Which)5,&(capnp::compiler::Token::Reader::getParenthesizedList()const)>>const&,capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::Param>>&>>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__34>,kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::LocatedExactString>,capnp::compiler::CapnpParser::Transform_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__35>,kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&,capnp::compiler::CapnpParser::Transform_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__36>>&>
            ((Sequence_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::Param>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:872:11)>,_kj::parse::Transform_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::LocatedExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:886:11)>,_kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:894:11)>_>_&>
              *)(local_1af8 + 0x18),(parse *)(local_1af8 + 8),
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)local_1860,
             (OneOf_<kj::parse::Transform_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::Param>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:872:11)>,_kj::parse::Transform_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::LocatedExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:886:11)>,_kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:894:11)>_>
              *)local_1af0.subParser);
  kj::parse::
  optional<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,(capnp::Kind)3>,(capnp::Kind)6>::Reader,(capnp::compiler::Token::Which)5,&(capnp::compiler::Token::Reader::getParenthesizedList()const)>>const&,capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::Param>>&>>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__34>,kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::LocatedExactString>,capnp::compiler::CapnpParser::Transform_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__35>,kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Expression>>&,capnp::compiler::CapnpParser::Transform_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__36>>&>>
            ((Optional_<_874350d4_> *)local_1ac0,(parse *)(local_1af8 + 0x18),subParser_08);
  local_1af8 = (undefined1  [8])
               kj::parse::
               many<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&>
                         (&(this->parsers).annotation);
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&,kj::parse::Optional_<kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,(capnp::Kind)3>,(capnp::Kind)6>::Reader,(capnp::compiler::Token::Which)6,&(capnp::compiler::Token::Reader::getBracketedList()const)>>const&,capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Read___mpiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&,false>>
            (&local_1a50,(parse *)compiler::(anonymous_namespace)::identifier,
             (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>
              *)subParsers_00,
             (ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>
              *)(local_1ac0 + 0x48),
             (Optional_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)6,_&capnp::compiler::Token::Reader::getBracketedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&>_>_>
              *)subParsers_2,
             (OneOf_<kj::parse::Transform_<kj::parse::Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::Param>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:872:11)>,_kj::parse::Transform_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::LocatedExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:886:11)>,_kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:894:11)>_>
              *)local_1ac0,(Optional_<_874350d4_> *)local_1af8,
             (Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>
              *)subParsers_5);
  annotationTarget =
       (OneOf_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformWithLocation_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:938:11)>_>
        *)this;
  kj::parse::transform<_6ebdf19a_>(&local_19e0,&local_1a50,(Type *)&annotationTarget);
  other_14 = kj::Arena::copy<_945c2d47_>(&this->arena,&local_19e0);
  kj::parse::
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
  ::operator=<_f7297bbf_>(&(this->parsers).methodDecl,other_14);
  TVar11 = anon_unknown_0::op("*");
  local_1b50 = (char *)TVar11.transform.expected;
  functor_00 = (Type *)TVar11.subParser;
  local_1b58 = functor_00;
  kj::parse::
  transformWithLocation<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__38>
            (&local_1b48,(parse *)&local_1b58,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)&local_1b59,functor_00);
  kj::parse::
  oneOf<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::TransformWithLocation_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__38>>
            (&local_1b30,(parse *)compiler::(anonymous_namespace)::identifier,
             (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>
              *)&local_1b48,
             (TransformWithLocation_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:938:11)>
              *)functor_00);
  local_1b08 = kj::Arena::
               copy<kj::parse::OneOf_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::TransformWithLocation_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__38>>>
                         (&this->arena,&local_1b30);
  local_1c58 = anon_unknown_0::keyword("annotation");
  local_1c60 = (undefined1  [8])
               kj::parse::
               optional<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&>
                         (&(this->parsers).uid);
  compiler::(anonymous_namespace)::
  parenthesizedList<kj::parse::OneOf_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::TransformWithLocation_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)4,&(capnp::compiler::Token::Reader::getOperator()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__38>>&>
            ((Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::OneOf_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformWithLocation_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:938:11)>_>_&>_>
              *)(local_1c98 + 0x10),(_anonymous_namespace_ *)local_1b08,
             (OneOf_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformWithLocation_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:938:11)>_>
              *)this->errorReporter,(ErrorReporter *)local_1c60);
  local_1c98._0_16_ = (undefined1  [16])anon_unknown_0::op(":");
  local_1ca0 = (undefined1  [8])
               kj::parse::
               many<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&>
                         (&(this->parsers).annotation);
  pPVar10 = (ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Expression>_>
             *)local_1ca0;
  pTVar4 = (TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>
            *)local_1c60;
  kj::parse::
  sequence<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&>,kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,(capnp::Kin___mpiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&,false>>
            (&local_1c48,(parse *)&local_1c58,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)compiler::(anonymous_namespace)::identifier,pTVar4,
             (Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&>
              *)(local_1c98 + 0x10),
             (Transform_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Reader,_(capnp::compiler::Token::Which)5,_&capnp::compiler::Token::Reader::getParenthesizedList>_>_&,_capnp::compiler::(anonymous_namespace)::ParseListItems<kj::parse::OneOf_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)0,_&capnp::compiler::Token::Reader::getIdentifier>_>_&,_kj::parse::TransformWithLocation_<kj::parse::TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:938:11)>_>_&>_>
              *)local_1c98,
             (TransformOrReject_<const_kj::parse::TransformOrReject_<const_kj::parse::Any__&,_capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,_(capnp::compiler::Token::Which)4,_&capnp::compiler::Token::Reader::getOperator>_>_&,_capnp::compiler::(anonymous_namespace)::ExactString>
              *)&(this->parsers).expression,pPVar10,
             (Many_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_false>
              *)pPVar1);
  nakedId = (Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:1005:7)>
             *)this;
  kj::parse::
  transform<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&>,kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::List<capnp::compi___e>>,capnp::compiler::CapnpParser::Sequence_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__39>
            (&local_1bd8,(parse *)&local_1c48,(Sequence_<_cfa8dfdf_> *)&nakedId,(Type *)pTVar4);
  other_15 = kj::Arena::
             copy<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::TransformOrReject_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,capnp::compiler::(anonymous_namespace)::ExactString>,kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::Text::Reader,(capnp::compiler::Token::Which)0,&(capnp::compiler::Token::Reader::getIdentifier()const)>>const&,kj::parse::Optional_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&>,kj::parse::Transform_<kj::parse::TransformOrReject_<kj::parse::Any_const&,capnp::compiler::(anonymous_namespace)::MatchTokenType<capnp::List<capnp::___>>,capnp::compiler::CapnpParser::Sequence_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__39>>
                       (&this->arena,&local_1bd8);
  kj::parse::
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
  ::operator=((ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
               *)&(this->parsers).annotationDecl,other_15);
  nakedAnnotation =
       (Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:1012:7)>
        *)this;
  local_1cc0 = kj::parse::
               transform<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__40>
                         (&(this->parsers).uid,(Type *)&nakedAnnotation);
  local_1cb0 = (ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
                *)kj::Arena::
                  copy<kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__40>>
                            (&this->arena,&local_1cc0);
  local_1ce8.this = this;
  local_1ce0 = kj::parse::
               transform<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__41>
                         (&(this->parsers).annotation,&local_1ce8);
  local_1cd0 = kj::Arena::
               copy<kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&,capnp::compiler::CapnpParser::CapnpParser(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__41>>
                         (&this->arena,&local_1ce0);
  parsers_2 = (Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:1012:7)>
               *)&(this->parsers).enumDecl;
  parsers_3_00 = &(this->parsers).structDecl;
  kj::parse::
  oneOf<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&>
            (&local_1d20,(parse *)&(this->parsers).usingDecl,&(this->parsers).constDecl,
             &(this->parsers).annotationDecl,
             (ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
              *)parsers_2,parsers_3_00,&(this->parsers).interfaceDecl,
             (ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
              *)pPVar10);
  other_16 = kj::Arena::
             copy<kj::parse::OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&>>
                       (&this->arena,&local_1d20);
  kj::parse::
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
  ::operator=((ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
               *)&this->parsers,other_16);
  kj::parse::
  oneOf<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&,capnp::compiler::CapnpParser::Transform_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__40>&,kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&,capnp::compiler::CapnpParser::Transform_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__41>&>
            (&local_1d40,(parse *)&this->parsers,local_1cb0,
             (Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::Orphan<capnp::compiler::LocatedInteger>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_parser_c__:1005:7)>
              *)local_1cd0,parsers_2);
  other_17 = kj::Arena::
             copy<kj::parse::OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::LocatedInteger>>&,capnp::compiler::CapnpParser::Transform_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__40>&,kj::parse::Transform_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>>&,capnp::compiler::CapnpParser::Transform_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__41>&>>
                       (&this->arena,&local_1d40);
  kj::parse::
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
  ::operator=((ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
               *)&(this->parsers).fileLevelDecl,other_17);
  local_1d50.first =
       (ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>
        *)kj::parse::
          oneOf<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&>
                    ((OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&>
                      *)&(this->parsers).enumerantDecl,(parse *)other_17,parsers);
  other_18 = kj::Arena::
             copy<kj::parse::OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&>>
                       (&this->arena,&local_1d50);
  kj::parse::
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
  ::operator=((ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
               *)&(this->parsers).enumLevelDecl,other_18);
  parsers_1 = &(this->parsers).groupDecl;
  kj::parse::
  oneOf<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&>
            (&local_1d78,(parse *)&(this->parsers).unionDecl,&(this->parsers).fieldDecl,parsers_1,
             &(this->parsers).genericDecl,parsers_3_00);
  other_19 = kj::Arena::
             copy<kj::parse::OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&>>
                       (&this->arena,&local_1d78);
  kj::parse::
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
  ::operator=((ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
               *)&(this->parsers).structLevelDecl,other_19);
  kj::parse::
  oneOf<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&>
            (&local_1d90,(parse *)&(this->parsers).methodDecl,&(this->parsers).genericDecl,parsers_1
            );
  other_20 = kj::Arena::
             copy<kj::parse::OneOf_<kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&,kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>&>>
                       (&this->arena,&local_1d90);
  kj::parse::
  ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
  ::operator=((ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,capnp::_::IndexingIterator<capnp::List<capnp::compiler::Token,(capnp::Kind)3>::Reader_const,capnp::compiler::Token::Reader>>,capnp::compiler::CapnpParser::DeclParserResult>
               *)&(this->parsers).interfaceLevelDecl,other_20);
  return;
}

Assistant:

CapnpParser::CapnpParser(Orphanage orphanageParam, ErrorReporter& errorReporterParam)
    : orphanage(orphanageParam), errorReporter(errorReporterParam) {
  auto& tupleElement = arena.copy(p::transform(
      p::sequence(p::optional(p::sequence(identifier, op("="))), parsers.expression),
      [this](kj::Maybe<Located<Text::Reader>>&& fieldName, Orphan<Expression>&& fieldValue)
             -> Orphan<Expression::Param> {
        auto result = orphanage.newOrphan<Expression::Param>();
        auto builder = result.get();
        KJ_IF_SOME(fn, fieldName) {
          fn.copyTo(builder.initNamed());
        } else {
          builder.setUnnamed();
        }
        builder.adoptValue(kj::mv(fieldValue));
        return kj::mv(result);
      }));

  auto& tuple = arena.copy<Parser<Located<Orphan<List<Expression::Param>>>>>(
      arena.copy(p::transform(
        parenthesizedList(tupleElement, errorReporter),
        [this](Located<kj::Array<kj::Maybe<Orphan<Expression::Param>>>>&& elements)
               -> Located<Orphan<List<Expression::Param>>> {
          auto result = orphanage.newOrphan<List<Expression::Param>>(elements.value.size());
          auto builder = result.get();
          for (uint i: kj::indices(elements.value)) {
            KJ_IF_SOME(e, elements.value[i]) {
              builder.adoptWithCaveats(i, kj::mv(e));
            } else {
              builder[i].initValue().setUnknown();
            }
          }
          return elements.rewrap(kj::mv(result));
        })));

  parsers.expression = arena.copy(p::transform(
      p::sequence(
          // Base expression.
          p::oneOf(
              p::transform(integerLiteral,
                  [this](Located<uint64_t>&& value) -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    builder.setPositiveInt(value.value);
                    value.copyLocationTo(builder);
                    return result;
                  }),
              p::transform(p::sequence(op("-"), integerLiteral),
                  [this](Located<uint64_t>&& value) -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    builder.setNegativeInt(value.value);
                    value.copyLocationTo(builder);
                    return result;
                  }),
              p::transform(floatLiteral,
                  [this](Located<double>&& value) -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    builder.setFloat(value.value);
                    value.copyLocationTo(builder);
                    return result;
                  }),
              p::transform(p::sequence(op("-"), floatLiteral),
                  [this](Located<double>&& value) -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    builder.setFloat(-value.value);
                    value.copyLocationTo(builder);
                    return result;
                  }),
              p::transformWithLocation(p::sequence(op("-"), keyword("inf")),
                  [this](kj::parse::Span<List<Token>::Reader::Iterator> location)
                      -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    builder.setFloat(-kj::inf());
                    initLocation(location, builder);
                    return result;
                  }),
              p::transform(p::oneOrMore(stringLiteral),
                  [this](kj::Array<Located<Text::Reader>>&& value) -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    builder.setString(kj::strArray(
                        KJ_MAP(part, value) { return part.value; }, ""));
                    builder.setStartByte(value.front().startByte);
                    builder.setEndByte(value.back().endByte);
                    return result;
                  }),
              p::transform(binaryLiteral,
                  [this](Located<Data::Reader>&& value) -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    builder.setBinary(value.value);
                    value.copyLocationTo(builder);
                    return result;
                  }),
              p::transform(bracketedList(parsers.expression, errorReporter),
                  [this](Located<kj::Array<kj::Maybe<Orphan<Expression>>>>&& value)
                      -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    auto listBuilder = builder.initList(value.value.size());
                    for (uint i = 0; i < value.value.size(); i++) {
                      KJ_IF_SOME(element, value.value[i]) {
                        listBuilder.adoptWithCaveats(i, kj::mv(element));
                      }
                    }
                    value.copyLocationTo(builder);
                    return result;
                  }),
              p::transform(tuple,
                  [this](Located<Orphan<List<Expression::Param>>>&& value)
                      -> Orphan<Expression> {
                    auto elements = value.value.get();

                    if (elements.size() == 1 && elements[0].isUnnamed()) {
                      // Single-value tuple is just a value.
                      return elements[0].disownValue();
                    } else {
                      auto result = orphanage.newOrphan<Expression>();
                      auto builder = result.get();
                      builder.adoptTuple(kj::mv(value.value));
                      value.copyLocationTo(builder);
                      return result;
                    }
                  }),
              p::transformWithLocation(p::sequence(keyword("import"), stringLiteral),
                  [this](kj::parse::Span<List<Token>::Reader::Iterator> location,
                         Located<Text::Reader>&& filename) -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    initLocation(location, builder);
                    filename.copyTo(builder.initImport());
                    return result;
                  }),
              p::transformWithLocation(p::sequence(keyword("embed"), stringLiteral),
                  [this](kj::parse::Span<List<Token>::Reader::Iterator> location,
                         Located<Text::Reader>&& filename) -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    initLocation(location, builder);
                    filename.copyTo(builder.initEmbed());
                    return result;
                  }),
              p::transformWithLocation(p::sequence(op("."), identifier),
                  [this](kj::parse::Span<List<Token>::Reader::Iterator> location,
                         Located<Text::Reader>&& name) -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    initLocation(location, builder);
                    name.copyTo(builder.initAbsoluteName());
                    return result;
                  }),
              p::transform(identifier,
                  [this](Located<Text::Reader>&& name) -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    name.copyTo(builder.initRelativeName());
                    name.copyLocationTo(builder);
                    return result;
                  })),
          // Suffixes, e.g. ".member" or "(param1, param2)".
          p::many(p::oneOf(
              p::transformWithLocation(p::sequence(op("."), identifier),
                  [this](kj::parse::Span<List<Token>::Reader::Iterator> location,
                         Located<Text::Reader>&& name) -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    initLocation(location, builder);
                    name.copyTo(builder.initMember().initName());
                    return result;
                  }),
              p::transform(tuple,
                  [this](Located<Orphan<List<Expression::Param>>>&& params) -> Orphan<Expression> {
                    auto result = orphanage.newOrphan<Expression>();
                    auto builder = result.get();
                    params.copyLocationTo(builder);
                    builder.initApplication().adoptParams(kj::mv(params.value));
                    return result;
                  })))),
      [](Orphan<Expression>&& base, kj::Array<Orphan<Expression>>&& suffixes)
          -> Orphan<Expression> {
        // Apply all the suffixes to the base expression.
        uint startByte = base.getReader().getStartByte();
        for (auto& suffix: suffixes) {
          auto builder = suffix.get();
          if (builder.isApplication()) {
            builder.getApplication().adoptFunction(kj::mv(base));
          } else if (builder.isMember()) {
            builder.getMember().adoptParent(kj::mv(base));
          } else {
            KJ_FAIL_ASSERT("Unknown suffix?", (uint)builder.which());
          }
          builder.setStartByte(startByte);
          base = kj::mv(suffix);
        }
        return kj::mv(base);
      }));

  parsers.annotation = arena.copy(p::transform(
      p::sequence(op("$"), parsers.expression),
      [this](Orphan<Expression>&& expression)
          -> Orphan<Declaration::AnnotationApplication> {
        auto result = orphanage.newOrphan<Declaration::AnnotationApplication>();
        auto builder = result.get();

        auto exp = expression.get();
        if (exp.isApplication()) {
          // Oops, this annotation specifies the value, but we parsed it as an application on
          // the preceding expression. Pull it back apart.
          auto app = exp.getApplication();
          builder.adoptName(app.disownFunction());
          auto params = app.getParams();
          if (params.size() == 1 && params[0].isUnnamed()) {
            // Params has a single unnamed element, so reduce it to a simple value rather than
            // a tuple.
            builder.getValue().adoptExpression(params[0].disownValue());
          } else {
            // Params is not a single unnamed element, so it's a tuple.
            builder.getValue().initExpression().adoptTuple(app.disownParams());
          }
        } else {
          // The annotation has no value.
          builder.adoptName(kj::mv(expression));
          builder.getValue().setNone();
        }

        return result;
      }));

  parsers.uid = arena.copy(p::transform(
      p::sequence(op("@"), integerLiteral),
      [this](Located<uint64_t>&& value) {
        if (value.value < (1ull << 63)) {
          errorReporter.addError(value.startByte, value.endByte,
              "Invalid ID.  Please generate a new one with 'capnpc -i'.");
        }
        return value.asProto<LocatedInteger>(orphanage);
      }));

  parsers.ordinal = arena.copy(p::transform(
      p::sequence(op("@"), integerLiteral),
      [this](Located<uint64_t>&& value) {
        if (value.value >= 65536) {
          errorReporter.addError(value.startByte, value.endByte,
              "Ordinals cannot be greater than 65535.");
        }
        return value.asProto<LocatedInteger>(orphanage);
      }));

  // -----------------------------------------------------------------

  parsers.usingDecl = arena.copy(p::transform(
      p::sequence(keyword("using"), p::optional(p::sequence(identifier, op("="))),
                  parsers.expression),
      [this](kj::Maybe<Located<Text::Reader>>&& name, Orphan<Expression>&& target)
          -> DeclParserResult {
        auto decl = orphanage.newOrphan<Declaration>();
        auto builder = decl.get();
        KJ_IF_SOME(n, name) {
          n.copyTo(builder.initName());
        } else {
          auto targetReader = target.getReader();
          if (targetReader.isMember()) {
            builder.setName(targetReader.getMember().getName());
          } else {
            errorReporter.addErrorOn(targetReader,
                "'using' declaration without '=' must specify a named declaration from a "
                "different scope.");
          }
        }
        // no id, no annotations for using decl
        builder.initUsing().adoptTarget(kj::mv(target));
        return DeclParserResult(kj::mv(decl));
      }